

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeConstraintError(Rtree *pRtree,int iCol)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  sqlite3_stmt *pStmt;
  
  pStmt = (sqlite3_stmt *)0x0;
  pcVar2 = sqlite3_mprintf("SELECT * FROM %Q.%Q",pRtree->zDb,pRtree->zName);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar1 = sqlite3_prepare_v2(pRtree->db,pcVar2,-1,&pStmt,(char **)0x0);
  }
  sqlite3_free(pcVar2);
  pStmt_00 = pStmt;
  if (iVar1 == 0) {
    if (iCol == 0) {
      pcVar2 = sqlite3_column_name(pStmt,0);
      pcVar2 = sqlite3_mprintf("UNIQUE constraint failed: %s.%s",pRtree->zName,pcVar2);
    }
    else {
      pcVar2 = sqlite3_column_name(pStmt,iCol);
      pcVar3 = sqlite3_column_name(pStmt_00,iCol + 1);
      pcVar2 = sqlite3_mprintf("rtree constraint failed: %s.(%s<=%s)",pRtree->zName,pcVar2,pcVar3);
    }
    (pRtree->base).zErrMsg = pcVar2;
    iVar1 = 0x13;
  }
  sqlite3_finalize(pStmt_00);
  return iVar1;
}

Assistant:

static int rtreeConstraintError(Rtree *pRtree, int iCol){
  sqlite3_stmt *pStmt = 0;
  char *zSql; 
  int rc;

  assert( iCol==0 || iCol%2 );
  zSql = sqlite3_mprintf("SELECT * FROM %Q.%Q", pRtree->zDb, pRtree->zName);
  if( zSql ){
    rc = sqlite3_prepare_v2(pRtree->db, zSql, -1, &pStmt, 0);
  }else{
    rc = SQLITE_NOMEM;
  }
  sqlite3_free(zSql);

  if( rc==SQLITE_OK ){
    if( iCol==0 ){
      const char *zCol = sqlite3_column_name(pStmt, 0);
      pRtree->base.zErrMsg = sqlite3_mprintf(
          "UNIQUE constraint failed: %s.%s", pRtree->zName, zCol
      );
    }else{
      const char *zCol1 = sqlite3_column_name(pStmt, iCol);
      const char *zCol2 = sqlite3_column_name(pStmt, iCol+1);
      pRtree->base.zErrMsg = sqlite3_mprintf(
          "rtree constraint failed: %s.(%s<=%s)", pRtree->zName, zCol1, zCol2
      );
    }
  }

  sqlite3_finalize(pStmt);
  return (rc==SQLITE_OK ? SQLITE_CONSTRAINT : rc);
}